

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_DefaultOpts_Test::~TApp_DefaultOpts_Test(TApp_DefaultOpts_Test *this)

{
  TApp::~TApp(&this->super_TApp);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, DefaultOpts) {

    int i = 3;
    std::string s = "HI";

    app.add_option("-i,i", i, "", false);
    app.add_option("-s,s", s, "", true);

    args = {"-i2", "9"};

    run();

    EXPECT_EQ((size_t)1, app.count("i"));
    EXPECT_EQ((size_t)1, app.count("-s"));
    EXPECT_EQ(2, i);
    EXPECT_EQ("9", s);
}